

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O1

void bonk_write(t_bonk *x,t_symbol *s)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int iVar3;
  t_template_conflict *ptVar4;
  char buf [1000];
  char local_418 [1000];
  
  iVar3 = x->x_ntemplate;
  ptVar4 = x->x_template;
  canvas_makefilename(x->x_canvas,s->s_name,local_418,1000);
  sys_bashfilename(local_418,local_418);
  __stream = fopen(local_418,"w");
  if (__stream == (FILE *)0x0) {
    post("%s: couldn\'t create",s->s_name);
  }
  else {
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      iVar1 = x->x_nfilters;
      if (iVar1 != 0) {
        lVar2 = 0;
        do {
          fprintf(__stream,"%6.2f ",(double)ptVar4->t_amp[lVar2]);
          lVar2 = lVar2 + 1;
        } while (iVar1 != (int)lVar2);
      }
      fputc(10,__stream);
      ptVar4 = ptVar4 + 1;
    }
    post("bonk: wrote %d templates\n",(ulong)(uint)x->x_ntemplate);
    fclose(__stream);
  }
  return;
}

Assistant:

static void bonk_write(t_bonk *x, t_symbol *s)
{
    FILE *fd;
    char buf[MAXPDSTRING]; /* fbar */
    int i, ntemplate = x->x_ntemplate;
    t_template *tp = x->x_template;
    t_float *fp;
    
    /* fbar: canvas-code as in g_array.c */
    canvas_makefilename(x->x_canvas, s->s_name,
        buf, MAXPDSTRING);
    sys_bashfilename(buf, buf);

    if (!(fd = fopen(buf, "w")))
    {
        post("%s: couldn't create", s->s_name);
        return;
    }
    for (; ntemplate--; tp++)
    {
        for (i = x->x_nfilters, fp = tp->t_amp; i--; fp++)
            fprintf(fd, "%6.2f ", *fp);
        fprintf(fd, "\n");
    }
    post("bonk: wrote %d templates\n", x->x_ntemplate);
    fclose(fd);
}